

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
mxx::gather<std::pair<int,double>>
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,mxx *this,pair<int,_double> *data,size_t size,int root,comm *comm
          )

{
  int iVar1;
  reference out;
  undefined4 in_register_00000084;
  comm *this_00;
  comm *comm_local;
  int root_local;
  size_t size_local;
  pair<int,_double> *data_local;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *result;
  
  this_00 = (comm *)CONCAT44(in_register_00000084,root);
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            (__return_storage_ptr__);
  iVar1 = mxx::comm::rank(this_00);
  if (iVar1 == (int)size) {
    iVar1 = mxx::comm::size(this_00);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::resize
              (__return_storage_ptr__,(long)data * (long)iVar1);
  }
  out = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  (__return_storage_ptr__,0);
  gather<std::pair<int,double>>((pair<int,_double> *)this,(size_t)data,out,(int)size,this_00);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gather(const T* data, size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result;
    if (comm.rank() == root)
        result.resize(size*comm.size());
    gather(data, size, &result[0], root, comm);
    return result;
}